

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Fire_PDU::Fire_PDU
          (Fire_PDU *this,Warfare_Header *WarfareHeader,KUINT32 FireMissionIndex,
          WorldCoordinates *Location,DescPtr *Desc,Vector *Velocity,KFLOAT32 Range)

{
  KFLOAT64 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT16 KVar5;
  KFLOAT32 KVar6;
  DescPtr local_28;
  
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Header6_00222c70;
  KVar2 = (WarfareHeader->super_Header).super_Header6.m_ui8ExerciseID;
  KVar3 = (WarfareHeader->super_Header).super_Header6.m_ui8PDUType;
  KVar4 = (WarfareHeader->super_Header).super_Header6.m_ui8ProtocolFamily;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       (WarfareHeader->super_Header).super_Header6.m_ui8ProtocolVersion;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ExerciseID = KVar2;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = KVar3;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolFamily = KVar4;
  (this->super_Warfare_Header).super_Header.super_Header6.m_TimeStamp.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__TimeStamp_00222cf8;
  (this->super_Warfare_Header).super_Header.super_Header6.m_TimeStamp.m_TimeStampUnion =
       (WarfareHeader->super_Header).super_Header6.m_TimeStamp.m_TimeStampUnion;
  (this->super_Warfare_Header).super_Header.super_Header6.m_TimeStamp.m_bAutoCalcRel =
       (WarfareHeader->super_Header).super_Header6.m_TimeStamp.m_bAutoCalcRel;
  KVar2 = (WarfareHeader->super_Header).super_Header6.m_ui8Padding1;
  KVar3 = (WarfareHeader->super_Header).super_Header6.m_ui8Padding2;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength =
       (WarfareHeader->super_Header).super_Header6.m_ui16PDULength;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8Padding1 = KVar2;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8Padding2 = KVar3;
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Header7_00223450;
  (this->super_Warfare_Header).super_Header.super_Header6.field_0x26 =
       (WarfareHeader->super_Header).super_Header6.field_0x26;
  *(undefined2 *)&(this->super_Warfare_Header).super_Header.super_Header6.field_0x24 =
       *(undefined2 *)&(WarfareHeader->super_Header).super_Header6.field_0x24;
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Warfare_Header_00225550;
  (this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00225f60;
  KVar5 = (WarfareHeader->m_FiringEntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.m_ui16SiteID =
       (WarfareHeader->m_FiringEntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar5;
  (this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__EntityIdentifier_00225c00;
  *(undefined2 *)&(this->super_Warfare_Header).m_FiringEntityID.super_SimulationIdentifier.field_0xc
       = *(undefined2 *)&(WarfareHeader->m_FiringEntityID).super_SimulationIdentifier.field_0xc;
  (this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00225f60;
  KVar5 = (WarfareHeader->m_TargetEntityID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.m_ui16SiteID =
       (WarfareHeader->m_TargetEntityID).super_SimulationIdentifier.m_ui16SiteID;
  (this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar5;
  (this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__EntityIdentifier_00225c00;
  *(undefined2 *)&(this->super_Warfare_Header).m_TargetEntityID.super_SimulationIdentifier.field_0xc
       = *(undefined2 *)&(WarfareHeader->m_TargetEntityID).super_SimulationIdentifier.field_0xc;
  (this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00225f60;
  KVar5 = (WarfareHeader->m_MunitionID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.m_ui16SiteID =
       (WarfareHeader->m_MunitionID).super_SimulationIdentifier.m_ui16SiteID;
  (this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.m_ui16ApplicationID = KVar5;
  (this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__EntityIdentifier_00225c00;
  *(undefined2 *)&(this->super_Warfare_Header).m_MunitionID.super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(WarfareHeader->m_MunitionID).super_SimulationIdentifier.field_0xc;
  (this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__SimulationIdentifier_00225f60;
  KVar5 = (WarfareHeader->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.m_ui16SiteID =
       (WarfareHeader->m_EventID).super_SimulationIdentifier.m_ui16SiteID;
  (this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.m_ui16ApplicationID = KVar5;
  (this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.super_DataTypeBase.
  _vptr_DataTypeBase = (_func_int **)&PTR__EntityIdentifier_00225c00;
  *(undefined2 *)&(this->super_Warfare_Header).m_EventID.super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(WarfareHeader->m_EventID).super_SimulationIdentifier.field_0xc;
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Fire_PDU_002254f8;
  this->m_ui32FireMissionIndex = FireMissionIndex;
  (this->m_Location).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00226228;
  KVar1 = Location->m_f64Y;
  (this->m_Location).m_f64X = Location->m_f64X;
  (this->m_Location).m_f64Y = KVar1;
  (this->m_Location).m_f64Z = Location->m_f64Z;
  (this->m_pDescriptor)._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002254c8;
  (this->m_pDescriptor).m_pRef = (Descriptor *)0x0;
  (this->m_pDescriptor).m_piCount = (RefCounter *)0x0;
  (this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002261d0;
  KVar6 = Velocity->m_f32Y;
  (this->m_Velocity).m_f32X = Velocity->m_f32X;
  (this->m_Velocity).m_f32Y = KVar6;
  (this->m_Velocity).m_f32Z = Velocity->m_f32Z;
  this->m_f32Range = Range;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x02';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x60;
  local_28._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002254c8;
  local_28.m_pRef = Desc->m_pRef;
  local_28.m_piCount = Desc->m_piCount;
  if (local_28.m_pRef != (Descriptor *)0x0) {
    *local_28.m_piCount = *local_28.m_piCount + 1;
  }
  SetDescriptor(this,&local_28);
  local_28._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_002254c8;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::unRef(&local_28);
  return;
}

Assistant:

Fire_PDU::Fire_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}